

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall gl4cts::GLSL420Pack::InitializerListTest::testInit(InitializerListTest *this)

{
  TESTED_INITIALIZERS local_30;
  uint local_2c;
  GLuint row_1;
  GLuint col;
  GLuint row;
  testCase test_case;
  TESTED_INITIALIZERS l_init;
  GLuint i;
  InitializerListTest *this_local;
  
  for (test_case.m_n_rows = 0; test_case.m_n_rows < 0x16;
      test_case.m_n_rows = test_case.m_n_rows + 1) {
    test_case.m_n_cols = test_case.m_n_rows;
    col = test_case.m_n_rows;
    row = 1;
    test_case.m_initializer = MATRIX;
    switch(test_case.m_n_rows) {
    case 0:
    case 5:
    case 6:
    case 0x13:
      for (row_1 = 2; row_1 < 5; row_1 = row_1 + 1) {
        test_case.m_initializer = row_1;
        std::
        vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
        ::push_back(&this->m_test_cases,(value_type *)&col);
      }
      break;
    case 1:
    case 2:
    case 7:
    case 8:
    case 0x14:
      for (local_2c = 2; local_2c < 5; local_2c = local_2c + 1) {
        for (local_30 = MATRIX_ROWS; local_30 < ARRAY_VECTOR_CTR; local_30 = local_30 + MATRIX) {
          row = local_2c;
          test_case.m_initializer = local_30;
          std::
          vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)&col);
        }
      }
      break;
    case 3:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x15:
      test_case.m_initializer = ARRAY_SCALAR;
      std::
      vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)&col);
      break;
    case 4:
    case 0x12:
      std::
      vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)&col);
    }
  }
  return true;
}

Assistant:

bool InitializerListTest::testInit()
{
	for (GLuint i = 0; i < TESTED_INITIALIZERS_MAX; ++i)
	{
		const TESTED_INITIALIZERS l_init = (TESTED_INITIALIZERS)i;

		testCase test_case = { l_init, 1, 1 };

		switch (l_init)
		{
		case VECTOR:
		case ARRAY_VECTOR_CTR:
		case ARRAY_VECTOR_LIST:
		case UNSIZED_ARRAY_VECTOR:
			for (GLuint row = 2; row <= 4; ++row)
			{
				test_case.m_n_rows = row;

				m_test_cases.push_back(test_case);
			}

			break;

		case MATRIX:
		case MATRIX_ROWS:
		case ARRAY_MATRIX_CTR:
		case ARRAY_MATRIX_LIST:
		case UNSIZED_ARRAY_MATRIX:
			for (GLuint col = 2; col <= 4; ++col)
			{
				for (GLuint row = 2; row <= 4; ++row)
				{
					test_case.m_n_cols = col;
					test_case.m_n_rows = row;

					m_test_cases.push_back(test_case);
				}
			}

			break;

		case ARRAY_SCALAR:
		case UNSIZED_ARRAY_SCALAR:
			m_test_cases.push_back(test_case);

			break;

		case STRUCT:
		case ARRAY_STRUCT:
		case NESTED_STRUCT_CTR:
		case NESTED_STRUCT_LIST:
		case NESTED_STURCT_ARRAYS_STRUCT_LIST:
		case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		case NESTED_ARRAY_STRUCT_STRUCT_LIST:
		case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		case NESTED_STRUCT_STRUCT_ARRAY_LIST:
		case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		case UNSIZED_ARRAY_STRUCT:
			test_case.m_n_rows = 4;
			m_test_cases.push_back(test_case);

			break;
		default:
			DE_ASSERT(0);
			break;
		}
	}

	return true;
}